

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O2

Aig_Man_t * Saig_ManUnrollCOI(Aig_Man_t *pAig,int nFrames)

{
  Aig_Obj_t **pObjMap;
  Aig_Man_t *p;
  char *pcVar1;
  long lVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  int i_00;
  size_t __nmemb;
  long lVar9;
  
  lVar9 = (long)nFrames;
  __nmemb = pAig->vObjs->nSize * lVar9;
  pObjMap = (Aig_Obj_t **)calloc(__nmemb,8);
  p = Aig_ManStart((int)__nmemb);
  pcVar1 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar1;
  pcVar1 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar1;
  lVar2 = 0;
  iVar8 = 0;
  if (0 < nFrames) {
    iVar8 = nFrames;
  }
  for (; iVar8 != (int)lVar2; lVar2 = lVar2 + 1) {
    pObjMap[pAig->pConst1->Id * lVar9 + lVar2] = p->pConst1;
  }
  for (iVar7 = 0; iVar7 != iVar8; iVar7 = iVar7 + 1) {
    for (iVar6 = 0; iVar6 < pAig->nObjs[2] - pAig->nRegs; iVar6 = iVar6 + 1) {
      pvVar3 = Vec_PtrEntry(pAig->vCis,iVar6);
      pAVar4 = Aig_ObjCreateCi(p);
      pObjMap[*(int *)((long)pvVar3 + 0x24) * nFrames + iVar7] = pAVar4;
    }
  }
  for (iVar7 = pAig->nObjs[2] - pAig->nRegs; iVar7 < pAig->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar7);
    pAVar4 = Aig_ObjCreateCi(p);
    pObjMap[*(int *)((long)pvVar3 + 0x24) * lVar9] = pAVar4;
  }
  iVar6 = nFrames + -1;
  iVar7 = 0;
  while (i_00 = iVar7, i_00 != iVar8) {
    for (iVar7 = 0; iVar7 < pAig->vObjs->nSize; iVar7 = iVar7 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar7);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Aig_ObjChild0Frames(pObjMap,nFrames,pAVar4,i_00);
        p1 = Aig_ObjChild1Frames(pObjMap,nFrames,pAVar4,i_00);
        pAVar5 = Aig_And(p,pAVar5,p1);
        pObjMap[pAVar4->Id * nFrames + i_00] = pAVar5;
      }
    }
    for (i = 0; iVar7 = i_00 + 1, i < pAig->nRegs; i = i + 1) {
      pAVar4 = Aig_ManLi(pAig,i);
      pAVar5 = Aig_ManLo(pAig,i);
      if (i_00 < iVar6) {
        pAVar4 = Aig_ObjChild0Frames(pObjMap,nFrames,pAVar4,i_00);
        pObjMap[pAVar5->Id * nFrames + i_00 + 1] = pAVar4;
      }
    }
  }
  for (; iVar6 < nFrames; iVar6 = iVar6 + 1) {
    for (iVar8 = 0; iVar8 < pAig->nObjs[3] - pAig->nRegs; iVar8 = iVar8 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar8);
      pAVar5 = Aig_ObjChild0Frames(pObjMap,nFrames,pAVar4,iVar6);
      pAVar5 = Aig_ObjCreateCo(p,pAVar5);
      pObjMap[pAVar4->Id * nFrames + iVar6] = pAVar5;
    }
  }
  if (pAig->pObjCopies != (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pObjCopies == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                  ,0x1e0,"Aig_Man_t *Saig_ManUnrollCOI(Aig_Man_t *, int)");
  }
  pAig->pObjCopies = pObjMap;
  return p;
}

Assistant:

Aig_Man_t * Saig_ManUnrollCOI( Aig_Man_t * pAig, int nFrames )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;
    // create mapping for the frames nodes
    pObjMap = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );
    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }
    // create the only output
    for ( f = nFrames-1; f < nFrames; f++ )
    {
        Aig_ManForEachPoSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
    }
    // created lots of dangling nodes - no sweeping!
    //Aig_ManCleanup( pFrames );
    assert( pAig->pObjCopies == NULL );
    pAig->pObjCopies = pObjMap;
    return pFrames;
}